

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,CaseStatement *stmt)

{
  bool bVar1;
  int iVar2;
  AbstractFlowAnalysis<TestAnalysis,_int> *pAVar3;
  long in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  pair<const_slang::ast::Statement_*,_bool> pVar4;
  bool covered;
  Expression *itemExpr;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  int finalState;
  type_conflict1 initialState;
  type_conflict *isKnown;
  type *knownBranch;
  EvalContext *in_stack_00000168;
  CaseStatement *in_stack_00000170;
  CaseStatement *in_stack_00000a20;
  FlowAnalysisBase *in_stack_00000a28;
  Expression *in_stack_ffffffffffffff58;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_ffffffffffffff60;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_78;
  reference local_70;
  reference local_68;
  ItemGroup *local_60;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_58;
  long local_50;
  int local_48;
  int local_44;
  type_conflict *local_40;
  type *local_38;
  Statement *local_30;
  undefined1 local_28;
  Statement *local_20;
  undefined1 local_18;
  long local_10;
  
  local_10 = in_RSI;
  visit<slang::ast::Expression>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pVar4 = ast::CaseStatement::getKnownBranch(in_stack_00000170,in_stack_00000168);
  local_30 = pVar4.first;
  local_28 = pVar4.second;
  local_20 = local_30;
  local_18 = local_28;
  local_38 = std::get<0ul,slang::ast::Statement_const*,bool>
                       ((pair<const_slang::ast::Statement_*,_bool> *)0x24cb1f);
  local_40 = std::get<1ul,slang::ast::Statement_const*,bool>
                       ((pair<const_slang::ast::Statement_*,_bool> *)0x24cb31);
  local_44 = in_RDI->state;
  local_48 = TestAnalysis::unreachableState((TestAnalysis *)in_RDI);
  local_50 = local_10 + 0x28;
  local_58._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff58);
  local_60 = (ItemGroup *)
             std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                       ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                        in_RDI);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = analysis::FlowAnalysisBase::isFullyCovered(in_stack_00000a28,in_stack_00000a20);
      if (*(long *)(local_10 + 0x38) == 0) {
        if (((*local_40 & 1U) == 0) && (!bVar1)) {
          TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_48,&local_44);
        }
      }
      else {
        if ((bVar1) || (((*local_40 & 1U) != 0 && (*local_38 != *(type *)(local_10 + 0x38))))) {
          setUnreachable(in_stack_ffffffffffffff60);
        }
        else {
          iVar2 = TestAnalysis::copyState((TestAnalysis *)in_RDI,&local_44);
          setState(in_RDI,iVar2);
        }
        visit<slang::ast::Statement>
                  (in_stack_ffffffffffffff60,(Statement *)in_stack_ffffffffffffff58);
        TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_48,&in_RDI->state);
      }
      setState(in_RDI,local_48);
      return;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
               ::operator*(&local_58);
    if ((*local_40 & 1U) == 0) {
LAB_0024cbe4:
      iVar2 = TestAnalysis::copyState((TestAnalysis *)in_RDI,&local_44);
      setState(in_RDI,iVar2);
    }
    else {
      in_stack_ffffffffffffff60 = (AbstractFlowAnalysis<TestAnalysis,_int> *)*local_38;
      pAVar3 = (AbstractFlowAnalysis<TestAnalysis,_int> *)
               not_null::operator_cast_to_Statement_
                         ((not_null<const_slang::ast::Statement_*> *)0x24cbcb);
      if (in_stack_ffffffffffffff60 == pAVar3) goto LAB_0024cbe4;
      setUnreachable(in_stack_ffffffffffffff60);
    }
    local_70 = local_68;
    local_78._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_ffffffffffffff58);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*(&local_78);
      visit<slang::ast::Expression>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_78);
    }
    not_null<const_slang::ast::Statement_*>::operator*
              ((not_null<const_slang::ast::Statement_*> *)0x24cc79);
    visit<slang::ast::Statement>(in_stack_ffffffffffffff60,(Statement *)in_stack_ffffffffffffff58);
    TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_48,&in_RDI->state);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }